

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TempFile * perfetto::base::TempFile::Create(void)

{
  uint __errnum;
  pointer pcVar1;
  code *pcVar2;
  int r;
  char *fname;
  uint *puVar3;
  char *pcVar4;
  TempFile *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  TempFile(in_RDI);
  GetSysTempDir_abi_cxx11_();
  ::std::operator+(&local_40,&local_60,"/perfetto-XXXXXXXX");
  ::std::__cxx11::string::operator=((string *)&in_RDI->path_,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  r = mkstemp((in_RDI->path_)._M_dataplus._M_p);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&in_RDI->fd_,r);
  if ((in_RDI->fd_).t_ != -1) {
    return in_RDI;
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  pcVar1 = (in_RDI->path_)._M_dataplus._M_p;
  puVar3 = (uint *)__errno_location();
  __errnum = *puVar3;
  pcVar4 = strerror(__errnum);
  LogMessage(kLogError,fname,0x18d5,"Could not create temp file %s (errno: %d, %s)",pcVar1,
             (ulong)__errnum,pcVar4);
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TempFile TempFile::Create() {
  TempFile temp_file;
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  temp_file.path_ = GetSysTempDir() + "\\" + GetTempName();
  // Several tests want to read-back the temp file while still open. On Windows,
  // that requires FILE_SHARE_READ. FILE_SHARE_READ is NOT settable when using
  // the POSIX-compat equivalent function _open(). Hence the CreateFileA +
  // _open_osfhandle dance here.
  HANDLE h =
      ::CreateFileA(temp_file.path_.c_str(), GENERIC_READ | GENERIC_WRITE,
                    FILE_SHARE_DELETE | FILE_SHARE_READ, nullptr, CREATE_ALWAYS,
                    FILE_ATTRIBUTE_TEMPORARY, nullptr);
  PERFETTO_CHECK(PlatformHandleChecker::IsValid(h));
  // According to MSDN, when using _open_osfhandle the caller must not call
  // CloseHandle(). Ownership is moved to the file descriptor, which then needs
  // to be closed with just with _close().
  temp_file.fd_.reset(_open_osfhandle(reinterpret_cast<intptr_t>(h), 0));
#else
  temp_file.path_ = GetSysTempDir() + "/perfetto-XXXXXXXX";
  temp_file.fd_.reset(mkstemp(&temp_file.path_[0]));
#endif
  if (PERFETTO_UNLIKELY(!temp_file.fd_)) {
    PERFETTO_FATAL("Could not create temp file %s", temp_file.path_.c_str());
  }
  return temp_file;
}